

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O3

void __thiscall binpac::FlowBuffer::MarkOrCopy(FlowBuffer *this)

{
  LineBreakStyle LVar1;
  int iVar2;
  const_byteptr puVar3;
  int iVar4;
  long lVar5;
  anon_enum_32 aVar6;
  int len;
  long lVar7;
  const_byteptr puVar8;
  const_byteptr puVar9;
  
  if (this->message_complete_ == false) {
    if (this->mode_ == FRAME_MODE) {
      if (((this->mode_ == FRAME_MODE) && (this->state_ == CR_OR_LF_1)) &&
         (puVar8 = this->orig_data_begin_, puVar8 < this->orig_data_end_)) {
        if (*puVar8 == '\n') {
          this->orig_data_begin_ = puVar8 + 1;
        }
        this->state_ = FRAME_0;
      }
      iVar4 = this->buffer_n_;
      if (iVar4 == 0) {
        if (((long)this->frame_length_ < 0) ||
           ((long)this->orig_data_end_ - (long)this->orig_data_begin_ < (long)this->frame_length_))
        {
          if (this->chunked_ == false) {
            AppendToBuffer(this,this->orig_data_begin_,
                           *(int *)&this->orig_data_end_ - (int)this->orig_data_begin_);
          }
          this->message_complete_ = false;
        }
        else {
          this->message_complete_ = true;
        }
        return;
      }
      len = *(int *)&this->orig_data_end_ - (int)this->orig_data_begin_;
      this->message_complete_ = false;
      iVar2 = this->frame_length_;
      if ((-1 < iVar2) && (iVar2 <= iVar4 + len)) {
        len = iVar2 - iVar4;
        this->message_complete_ = true;
      }
      AppendToBuffer(this,this->orig_data_begin_,len);
      return;
    }
    if (this->mode_ == CR_OR_LF_1) {
      LVar1 = this->linebreak_style_;
      if (LVar1 == LINE_BREAKER) {
        puVar8 = this->orig_data_begin_;
        if ((puVar8 != (const_byteptr)0x0) &&
           (puVar3 = this->orig_data_end_, puVar3 != (const_byteptr)0x0)) {
          if (puVar8 < puVar3) {
            lVar7 = 0;
            do {
              if (puVar8[lVar7] == this->linebreaker_) {
                if (this->buffer_n_ == 0) {
                  this->frame_length_ = (int)lVar7;
                }
                else {
                  AppendToBuffer(this,puVar8,(int)lVar7 + 1);
                  this->buffer_n_ = this->buffer_n_ + -1;
                }
                this->message_complete_ = true;
                return;
              }
              lVar5 = lVar7 + 1;
              lVar7 = lVar7 + 1;
            } while (puVar8 + lVar5 != puVar3);
          }
          AppendToBuffer(this,puVar8,(int)puVar3 - (int)puVar8);
          return;
        }
        return;
      }
      if (LVar1 == STRICT_CRLF) {
        puVar8 = this->orig_data_begin_;
        puVar3 = this->orig_data_end_;
        if (puVar8 < puVar3) {
          aVar6 = this->state_;
          iVar4 = -1;
          puVar9 = puVar8;
          do {
            if (*puVar9 == '\r') {
              aVar6 = STRICT_CRLF_1;
LAB_0010296b:
              this->state_ = aVar6;
            }
            else {
              if (*puVar9 != '\n') {
                aVar6 = FRAME_MODE;
                goto LAB_0010296b;
              }
              if (aVar6 == STRICT_CRLF_1) {
                this->state_ = FRAME_MODE;
                if (this->buffer_n_ == 0) {
                  this->frame_length_ = iVar4;
                }
                else {
                  AppendToBuffer(this,puVar8,iVar4 + 2);
                  this->buffer_n_ = this->buffer_n_ + -2;
                }
                this->message_complete_ = true;
                return;
              }
            }
            puVar9 = puVar9 + 1;
            iVar4 = iVar4 + 1;
          } while (puVar9 != puVar3);
        }
        AppendToBuffer(this,puVar8,(int)puVar3 - (int)puVar8);
        return;
      }
      if (LVar1 != CR_OR_LF) {
        return;
      }
      puVar8 = this->orig_data_begin_;
      if ((puVar8 == (const_byteptr)0x0) ||
         (puVar3 = this->orig_data_end_, puVar3 == (const_byteptr)0x0)) {
        return;
      }
      if ((puVar8 < puVar3) && ((this->state_ == CR_OR_LF_1 && (*puVar8 == '\n')))) {
        this->state_ = CR_OR_LF_0;
        puVar8 = puVar8 + 1;
        this->orig_data_begin_ = puVar8;
      }
      lVar7 = (long)puVar3 - (long)puVar8;
      if (puVar8 <= puVar3 && lVar7 != 0) {
        lVar5 = 0;
        do {
          if (puVar8[lVar5] == '\n') {
LAB_0010290b:
            if (this->buffer_n_ == 0) {
              this->frame_length_ = (int)lVar5;
            }
            else {
              AppendToBuffer(this,puVar8,(int)lVar5 + 1);
              this->buffer_n_ = this->buffer_n_ + -1;
            }
            this->message_complete_ = true;
            return;
          }
          if (puVar8[lVar5] == '\r') {
            this->state_ = CR_OR_LF_1;
            goto LAB_0010290b;
          }
          lVar5 = lVar5 + 1;
        } while (lVar7 != lVar5);
      }
      AppendToBuffer(this,puVar8,(int)lVar7);
      return;
    }
  }
  return;
}

Assistant:

void FlowBuffer::MarkOrCopy()
	{
	if ( ! message_complete_ )
		{
		switch ( mode_ )
			{
			case LINE_MODE:
				MarkOrCopyLine();
				break;

			case FRAME_MODE:
				MarkOrCopyFrame();
				break;

			default:
				break;
			}
		}
	}